

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char cVar1;
  char *pcVar2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar3;
  Ch *pCVar4;
  Ch *pCVar5;
  bool bVar6;
  int iVar7;
  bool bVar8;
  undefined4 uVar9;
  long lVar10;
  uint uVar11;
  uint i;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar12;
  byte bVar13;
  int iVar14;
  ulong uVar15;
  byte bVar16;
  int iVar17;
  ulong i_00;
  byte *pbVar18;
  byte *pbVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double d;
  
  bVar13 = *is->src_;
  if (bVar13 < 0x6e) {
    if (bVar13 == 0x22) {
      ParseString<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler,false);
      return;
    }
    if (bVar13 == 0x66) {
      pCVar4 = is->src_;
      is->src_ = pCVar4 + 1;
      if ((((pCVar4[1] == 'a') && (is->src_ = pCVar4 + 2, pCVar4[2] == 'l')) &&
          (is->src_ = pCVar4 + 3, pCVar4[3] == 's')) && (is->src_ = pCVar4 + 4, pCVar4[4] == 'e')) {
        is->src_ = pCVar4 + 5;
        if ((long)(handler->stack_).stackEnd_ - (long)(handler->stack_).stackTop_ < 0x10) {
          internal::Stack<rapidjson::CrtAllocator>::
          Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                    (&handler->stack_,1);
        }
        pcVar2 = (handler->stack_).stackTop_;
        (handler->stack_).stackTop_ = pcVar2 + 0x10;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        pcVar2[8] = '\0';
        pcVar2[9] = '\0';
        pcVar2[10] = '\0';
        pcVar2[0xb] = '\0';
        pcVar2[0xc] = '\0';
        pcVar2[0xd] = '\0';
        pcVar2[0xe] = '\0';
        pcVar2[0xf] = '\0';
        pcVar2[0xe] = '\t';
        pcVar2[0xf] = '\0';
        return;
      }
      pCVar4 = is->src_;
      pCVar5 = is->head_;
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pCVar4 - (long)pCVar5;
      return;
    }
    if (bVar13 != 0x5b) {
      ParseNumber<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler);
      return;
    }
    is->src_ = is->src_ + 1;
    bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::StartArray(handler);
    if (bVar8) {
      SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,is)
      ;
      if (*(int *)(this + 0x30) == 0) {
        if (*is->src_ == ']') {
          is->src_ = is->src_ + 1;
          pcVar2 = (handler->stack_).stackTop_;
          pcVar2[-8] = '\0';
          pcVar2[-7] = '\0';
          pcVar2[-6] = '\0';
          pcVar2[-5] = '\0';
          pcVar2[-4] = '\0';
          pcVar2[-3] = '\0';
          pcVar2[-2] = '\x04';
          pcVar2[-1] = '\0';
          pcVar2[-0x10] = '\0';
          pcVar2[-0xf] = '\0';
          pcVar2[-0xe] = '\0';
          pcVar2[-0xd] = '\0';
          pcVar2[-0xc] = '\0';
          pcVar2[-0xb] = '\0';
          pcVar2[-10] = '\0';
          pcVar2[-9] = '\0';
        }
        else {
          uVar11 = 0;
          do {
            ParseValue<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                      (this,is);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            if (*is->src_ != ',') {
              if (*is->src_ == ']') {
                uVar11 = uVar11 + 1;
                is->src_ = is->src_ + 1;
                pMVar3 = handler->allocator_;
                pcVar2 = (handler->stack_).stackTop_;
                pGVar12 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)(pcVar2 + (ulong)uVar11 * -0x10);
                (handler->stack_).stackTop_ = (char *)pGVar12;
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::SetArrayRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)(pcVar2 + (ulong)uVar11 * -0x10 + -0x10),pGVar12,uVar11,pMVar3);
                return;
              }
              lVar10 = (long)is->src_ - (long)is->head_;
              *(undefined4 *)(this + 0x30) = 7;
              goto LAB_0013b2f8;
            }
            is->src_ = is->src_ + 1;
            SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                      (this,is);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            uVar11 = uVar11 + 1;
          } while (*is->src_ != ']');
          pMVar3 = handler->allocator_;
          pcVar2 = (handler->stack_).stackTop_;
          pGVar12 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)(pcVar2 + (ulong)uVar11 * -0x10);
          (handler->stack_).stackTop_ = (char *)pGVar12;
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::SetArrayRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)(pcVar2 + (ulong)uVar11 * -0x10 + -0x10),pGVar12,uVar11,pMVar3);
          is->src_ = is->src_ + 1;
        }
      }
    }
    else {
      lVar10 = (long)is->src_ - (long)is->head_;
      *(undefined4 *)(this + 0x30) = 0x10;
LAB_0013b2f8:
      *(long *)(this + 0x38) = lVar10;
    }
    return;
  }
  if (bVar13 == 0x6e) {
    pCVar4 = is->src_;
    is->src_ = pCVar4 + 1;
    if (((pCVar4[1] == 'u') && (is->src_ = pCVar4 + 2, pCVar4[2] == 'l')) &&
       (is->src_ = pCVar4 + 3, pCVar4[3] == 'l')) {
      is->src_ = pCVar4 + 4;
      if ((long)(handler->stack_).stackEnd_ - (long)(handler->stack_).stackTop_ < 0x10) {
        internal::Stack<rapidjson::CrtAllocator>::
        Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                  (&handler->stack_,1);
      }
      pcVar2 = (handler->stack_).stackTop_;
      (handler->stack_).stackTop_ = pcVar2 + 0x10;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = '\0';
      pcVar2[5] = '\0';
      pcVar2[6] = '\0';
      pcVar2[7] = '\0';
      pcVar2[8] = '\0';
      pcVar2[9] = '\0';
      pcVar2[10] = '\0';
      pcVar2[0xb] = '\0';
      pcVar2[0xc] = '\0';
      pcVar2[0xd] = '\0';
      pcVar2[0xe] = '\0';
      pcVar2[0xf] = '\0';
      return;
    }
    pCVar4 = is->src_;
    pCVar5 = is->head_;
    *(undefined4 *)(this + 0x30) = 3;
    *(long *)(this + 0x38) = (long)pCVar4 - (long)pCVar5;
    return;
  }
  if (bVar13 == 0x74) {
    pCVar4 = is->src_;
    is->src_ = pCVar4 + 1;
    if (((pCVar4[1] == 'r') && (is->src_ = pCVar4 + 2, pCVar4[2] == 'u')) &&
       (is->src_ = pCVar4 + 3, pCVar4[3] == 'e')) {
      is->src_ = pCVar4 + 4;
      if ((long)(handler->stack_).stackEnd_ - (long)(handler->stack_).stackTop_ < 0x10) {
        internal::Stack<rapidjson::CrtAllocator>::
        Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                  (&handler->stack_,1);
      }
      pcVar2 = (handler->stack_).stackTop_;
      (handler->stack_).stackTop_ = pcVar2 + 0x10;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = '\0';
      pcVar2[5] = '\0';
      pcVar2[6] = '\0';
      pcVar2[7] = '\0';
      pcVar2[8] = '\0';
      pcVar2[9] = '\0';
      pcVar2[10] = '\0';
      pcVar2[0xb] = '\0';
      pcVar2[0xc] = '\0';
      pcVar2[0xd] = '\0';
      pcVar2[0xe] = '\0';
      pcVar2[0xf] = '\0';
      pcVar2[0xe] = '\n';
      pcVar2[0xf] = '\0';
      return;
    }
    pCVar4 = is->src_;
    pCVar5 = is->head_;
    *(undefined4 *)(this + 0x30) = 3;
    *(long *)(this + 0x38) = (long)pCVar4 - (long)pCVar5;
    return;
  }
  if (bVar13 == 0x7b) {
    ParseObject<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pcVar2 = is->src_;
  pCVar4 = is->head_;
  cVar1 = *pcVar2;
  pbVar19 = (byte *)(pcVar2 + (cVar1 == '-'));
  bVar13 = pcVar2[cVar1 == '-'];
  if (bVar13 == 0x30) {
    pbVar18 = pbVar19 + 1;
    bVar8 = false;
    iVar14 = 0;
    uVar11 = 0;
    i = 0;
    goto LAB_001424fd;
  }
  if ((byte)(bVar13 - 0x31) < 9) {
    i = bVar13 - 0x30;
    uVar11 = (uint)pbVar19[1];
    pbVar18 = pbVar19 + 1;
    bVar13 = pbVar19[1] - 0x30;
    if (cVar1 == '-') {
      if (bVar13 < 10) {
        iVar14 = 0;
        do {
          if ((0xccccccb < i) && ('8' < (char)uVar11 || i != 0xccccccc)) goto LAB_001424f5;
          i = (uVar11 + i * 10) - 0x30;
          iVar14 = iVar14 + 1;
          pbVar19 = pbVar18 + 1;
          uVar11 = (uint)*pbVar19;
          pbVar18 = pbVar18 + 1;
        } while ((byte)(*pbVar19 - 0x30) < 10);
      }
      else {
LAB_00142a61:
        iVar14 = 0;
      }
    }
    else {
      if (9 < bVar13) goto LAB_00142a61;
      iVar14 = 0;
      do {
        if ((0x19999998 < i) && ('5' < (char)uVar11 || i != 0x19999999)) goto LAB_001424f5;
        i = (uVar11 + i * 10) - 0x30;
        iVar14 = iVar14 + 1;
        pbVar19 = pbVar18 + 1;
        uVar11 = (uint)*pbVar19;
        pbVar18 = pbVar18 + 1;
      } while ((byte)(*pbVar19 - 0x30) < 10);
    }
    bVar8 = false;
    uVar11 = 0;
    goto LAB_001424fd;
  }
  lVar10 = (long)pbVar19 - (long)pCVar4;
  uVar9 = 3;
  goto LAB_00142a70;
LAB_001424f5:
  bVar8 = true;
  uVar11 = i;
LAB_001424fd:
  i_00 = (ulong)uVar11;
  dVar24 = 0.0;
  if (bVar8) {
    bVar13 = *pbVar18;
    bVar16 = bVar13 - 0x30;
    if (cVar1 == '-') {
      while (bVar16 < 10) {
        if ((0xccccccccccccccb < i_00) && (i_00 != 0xccccccccccccccc || '8' < (char)bVar13))
        goto LAB_001425da;
        i_00 = (ulong)(bVar13 & 0xf) + i_00 * 10;
        iVar14 = iVar14 + 1;
        bVar13 = pbVar18[1];
        pbVar18 = pbVar18 + 1;
        bVar16 = bVar13 - 0x30;
      }
    }
    else {
      while (bVar16 < 10) {
        if ((0x1999999999999998 < i_00) && (i_00 != 0x1999999999999999 || '5' < (char)bVar13))
        goto LAB_001425da;
        i_00 = (ulong)(bVar13 & 0xf) + i_00 * 10;
        iVar14 = iVar14 + 1;
        bVar13 = pbVar18[1];
        pbVar18 = pbVar18 + 1;
        bVar16 = bVar13 - 0x30;
      }
    }
  }
  bVar6 = false;
  goto LAB_00142603;
LAB_001425da:
  auVar21._8_4_ = (int)(i_00 >> 0x20);
  auVar21._0_8_ = i_00;
  auVar21._12_4_ = 0x45300000;
  dVar24 = (auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i_00) - 4503599627370496.0);
  bVar6 = true;
LAB_00142603:
  if (bVar6) {
    bVar13 = *pbVar18;
    while ((byte)(bVar13 - 0x30) < 10) {
      dVar24 = dVar24 * 10.0 + (double)(int)(bVar13 - 0x30);
      pbVar19 = pbVar18 + 1;
      pbVar18 = pbVar18 + 1;
      bVar13 = *pbVar19;
    }
  }
  pbVar19 = pbVar18 + (*pbVar18 == 0x2e);
  iVar17 = 0;
  if (*pbVar18 == 0x2e) {
    if (0xf5 < (byte)(*pbVar19 - 0x3a)) {
      iVar17 = 0;
      if (!bVar6) {
        uVar15 = (ulong)i;
        if (bVar8) {
          uVar15 = i_00;
        }
        i_00 = uVar15;
        bVar13 = *pbVar19;
        iVar17 = 0;
        if ((0xf5 < (byte)(bVar13 - 0x3a)) && (i_00 < 0x20000000000000)) {
          lVar10 = 0;
          do {
            i_00 = (ulong)(bVar13 & 0xf) + i_00 * 10;
            iVar14 = (uint)(i_00 != 0) + iVar14;
            bVar13 = pbVar19[lVar10 + 1];
            lVar10 = lVar10 + 1;
            if ((byte)(bVar13 - 0x3a) < 0xf6) break;
          } while (i_00 < 0x20000000000000);
          iVar17 = -(int)lVar10;
          pbVar19 = pbVar19 + lVar10;
        }
        auVar22._8_4_ = (int)(i_00 >> 0x20);
        auVar22._0_8_ = i_00;
        auVar22._12_4_ = 0x45300000;
        dVar24 = (auVar22._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)i_00) - 4503599627370496.0);
        bVar6 = true;
      }
      bVar13 = *pbVar19;
      while ((byte)(bVar13 - 0x30) < 10) {
        if (iVar14 < 0x11) {
          dVar24 = (double)(int)(bVar13 - 0x30) + dVar24 * 10.0;
          iVar17 = iVar17 + -1;
          if (0.0 < dVar24) {
            iVar14 = iVar14 + 1;
          }
        }
        pbVar18 = pbVar19 + 1;
        pbVar19 = pbVar19 + 1;
        bVar13 = *pbVar18;
      }
      goto LAB_00142777;
    }
    lVar10 = (long)pbVar19 - (long)pCVar4;
    uVar9 = 0xe;
  }
  else {
LAB_00142777:
    lVar10 = (long)pcVar2 - (long)pCVar4;
    bVar13 = *pbVar19;
    pbVar19 = pbVar19 + (bVar13 == 0x65);
    if (bVar13 == 0x65) {
LAB_001427b5:
      uVar15 = (ulong)i;
      if (bVar8) {
        uVar15 = i_00;
      }
      if (!bVar6) {
        auVar23._8_4_ = (int)(uVar15 >> 0x20);
        auVar23._0_8_ = uVar15;
        auVar23._12_4_ = 0x45300000;
        dVar24 = (auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0);
        bVar6 = true;
      }
      bVar13 = *pbVar19;
      pbVar19 = pbVar19 + (bVar13 == 0x2b);
      bVar20 = false;
      if (bVar13 != 0x2b) {
        bVar20 = *pbVar19 == 0x2d;
        pbVar19 = pbVar19 + bVar20;
      }
      bVar13 = *pbVar19;
      if ((byte)(bVar13 - 0x30) < 10) {
        pbVar19 = pbVar19 + 1;
        iVar14 = bVar13 - 0x30;
        if (bVar20) {
          bVar13 = *pbVar19;
          if ((byte)(bVar13 - 0x30) < 10) {
            do {
              iVar14 = (uint)bVar13 + iVar14 * 10 + -0x30;
              if ((iVar17 + 0x7ffffff7) / 10 < iVar14) {
                do {
                  pbVar18 = pbVar19 + 1;
                  pbVar19 = pbVar19 + 1;
                } while ((byte)(*pbVar18 - 0x30) < 10);
              }
              else {
                pbVar19 = pbVar19 + 1;
              }
              bVar13 = *pbVar19;
            } while ((byte)(bVar13 - 0x30) < 10);
          }
        }
        else {
          do {
            bVar13 = *pbVar19;
            bVar16 = bVar13 - 0x30;
            if (9 < bVar16) goto LAB_001428e0;
            pbVar19 = pbVar19 + 1;
            iVar14 = (uint)bVar13 + iVar14 * 10 + -0x30;
          } while (iVar14 <= 0x134 - iVar17);
          *(undefined4 *)(this + 0x30) = 0xd;
          *(long *)(this + 0x38) = lVar10;
LAB_001428e0:
          if (bVar16 < 10) {
            bVar20 = false;
            goto LAB_00142900;
          }
        }
        iVar7 = -iVar14;
        if (!bVar20) {
          iVar7 = iVar14;
        }
        iVar14 = iVar7;
        bVar20 = true;
      }
      else {
        *(undefined4 *)(this + 0x30) = 0xf;
        *(long *)(this + 0x38) = (long)pbVar19 - (long)pCVar4;
        bVar20 = false;
        iVar14 = 0;
      }
LAB_00142900:
      if (!bVar20) goto LAB_00142a00;
    }
    else {
      bVar13 = *pbVar19;
      pbVar19 = pbVar19 + (bVar13 == 0x45);
      iVar14 = 0;
      if (bVar13 == 0x45) goto LAB_001427b5;
    }
    if (bVar6) {
      uVar11 = iVar14 + iVar17;
      if ((int)uVar11 < -0x134) {
        d = 0.0;
        if (-0x269 < (int)uVar11) {
          d = dVar24 / (*(double *)(internal::Pow10(int)::e + (ulong)(-uVar11 - 0x134) * 8) * 1e+308
                       );
        }
      }
      else if ((int)uVar11 < 0) {
        d = dVar24 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar11 * 8);
      }
      else {
        d = dVar24 * *(double *)(internal::Pow10(int)::e + (ulong)uVar11 * 8);
      }
      if (d <= 1.79769313486232e+308) {
        if (cVar1 == '-') {
          d = -d;
        }
        bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Double(handler,d);
        goto LAB_001429f6;
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = lVar10;
      bVar6 = true;
      bVar8 = true;
    }
    else {
      if (bVar8) {
        if (cVar1 == '-') {
          bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Int64(handler,-i_00);
        }
        else {
          bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Uint64(handler,i_00);
        }
      }
      else if (cVar1 == '-') {
        bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int(handler,-i);
      }
      else {
        bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Uint(handler,i);
      }
LAB_001429f6:
      bVar6 = false;
    }
    if ((bVar6) || (bVar8 != false)) goto LAB_00142a00;
    uVar9 = 0x10;
  }
LAB_00142a70:
  *(undefined4 *)(this + 0x30) = uVar9;
  *(long *)(this + 0x38) = lVar10;
LAB_00142a00:
  is->src_ = (Ch *)pbVar19;
  is->head_ = pCVar4;
  return;
}

Assistant:

Ch Peek() const { return *src_; }